

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall nuraft::rpc_session::start(rpc_session *this,ptr<rpc_session> *self)

{
  uint uVar1;
  element_type *this_00;
  type *in_RSI;
  mutable_buffers_1 *in_RDI;
  size_t *size_in_bytes;
  undefined4 in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  ssl_socket *_ssl_socket;
  buffer *in_stack_ffffffffffffffb0;
  undefined1 is_ssl;
  
  size_in_bytes = &in_RDI[0x20].super_mutable_buffer.size_;
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x29be4d);
  nuraft::buffer::pos(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  _ssl_socket = (ssl_socket *)&in_RDI[8].super_mutable_buffer.size_;
  is_ssl = (undefined1)((ulong)(in_RDI + 3) >> 0x38);
  uVar1 = (uint)*(byte *)&in_RDI[0x1f].super_mutable_buffer.data_;
  this_00 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x29be8d);
  nuraft::buffer::data(this_00);
  asio::buffer(in_RSI,(size_t)size_in_bytes);
  std::shared_ptr<nuraft::rpc_session>::shared_ptr
            ((shared_ptr<nuraft::rpc_session> *)in_RSI,
             (shared_ptr<nuraft::rpc_session> *)size_in_bytes);
  aa::
  read<asio::mutable_buffers_1,nuraft::rpc_session::start(std::shared_ptr<nuraft::rpc_session>)::_lambda(std::error_code_const&,unsigned_long)_1_>
            ((bool)is_ssl,_ssl_socket,(socket *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),in_RDI,
             in_RSI);
  start(std::shared_ptr<nuraft::rpc_session>)::{lambda(std::error_code_const&,unsigned_long)#1}::
  ~error_code((type *)0x29bef4);
  return;
}

Assistant:

void start(ptr<rpc_session> self) {
        header_->pos(0);
        aa::read( ssl_enabled_, ssl_socket_, socket_,
                  asio::buffer( header_->data(), RPC_REQ_HEADER_SIZE ),
                  [this, self]
                  (const ERROR_CODE& err, size_t) -> void
        {
            if (err) {
                p_er( "session %" PRIu64 " failed to read rpc header from socket %s:%u "
                      "due to error %d, %s, ref count %ld",
                      session_id_,
                      cached_address_.c_str(),
                      cached_port_,
                      err.value(),
                      err.message().c_str(),
                      self.use_count() );
                this->stop();
                return;
            }

            // NOTE:
            //  due to async_read() above, header_ size will be always
            //  equal to or greater than RPC_REQ_HEADER_SIZE.
            header_->pos(0);
            byte* header_data = header_->data();
            uint32_t crc_local = crc32_8( header_data,
                                          RPC_REQ_HEADER_SIZE - CRC_FLAGS_LEN,
                                          0 );

            header_->pos(RPC_REQ_HEADER_SIZE - CRC_FLAGS_LEN);
            uint64_t flags_and_crc = header_->get_ulong();
            uint32_t crc_hdr = flags_and_crc & (uint32_t)0xffffffff;
            flags_ = (flags_and_crc >> 32);

            // Verify CRC.
            if (crc_local != crc_hdr) {
                p_er("CRC mismatch: local calculation %x, from header %x",
                     crc_local, crc_hdr);
                this->stop();
                return;
            }

            header_->pos(0);
            byte marker = header_->get_byte();
            if (marker == 0x1) {
                // Means that this is RPC_RESP, shouldn't happen.
                p_er("Wrong packet: expected REQ, got RESP");
                this->stop();
                return;
            }

            header_->pos(RPC_REQ_HEADER_SIZE - CRC_FLAGS_LEN - DATA_SIZE_LEN);
            int32 data_size = header_->get_int();
            // Up to 1GB.
            if (data_size < 0 || data_size > 0x40000000) {
                p_er("bad log data size in the header %d, stop "
                     "this session to protect further corruption",
                     data_size);
                this->stop();
                return;
            }

            if (data_size == 0) {
                // Don't carry data, immediately process request.
                this->read_complete(header_, nullptr);

            } else {
                // Carry some data, need to read further.
                ptr<buffer> log_ctx = buffer::alloc((size_t)data_size);
                aa::read( ssl_enabled_, ssl_socket_, socket_,
                          asio::buffer( log_ctx->data(),
                                        (size_t)data_size ),
                          std::bind( &rpc_session::read_log_data,
                                     self,
                                     log_ctx,
                                     std::placeholders::_1,
                                     std::placeholders::_2 ) );
            }
        } );
    }